

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_connect(Curl_easy *data,connectdata *conn,int sockindex)

{
  undefined1 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  
  if (((conn->bits).proxy_ssl_connected[sockindex] == true) &&
     (CVar3 = ssl_connect_init_proxy(conn,sockindex), CVar3 != CURLE_OK)) {
    return CVar3;
  }
  _Var2 = ssl_prefs_check(data);
  if (_Var2) {
    puVar1 = &conn->ssl[sockindex].field_0x10;
    *puVar1 = *puVar1 | 1;
    conn->ssl[sockindex].state = ssl_connection_negotiating;
    CVar3 = (*Curl_ssl->connect_blocking)(data,conn,sockindex);
    if (CVar3 == CURLE_OK) {
      Curl_pgrsTime(data,TIMER_APPCONNECT);
      CVar3 = CURLE_OK;
    }
    else {
      puVar1 = &conn->ssl[sockindex].field_0x10;
      *puVar1 = *puVar1 & 0xfe;
    }
  }
  else {
    CVar3 = CURLE_SSL_CONNECT_ERROR;
  }
  return CVar3;
}

Assistant:

CURLcode
Curl_ssl_connect(struct Curl_easy *data, struct connectdata *conn,
                 int sockindex)
{
  CURLcode result;

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }
#endif

  if(!ssl_prefs_check(data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl-enabled from here on. */
  conn->ssl[sockindex].use = TRUE;
  conn->ssl[sockindex].state = ssl_connection_negotiating;

  result = Curl_ssl->connect_blocking(data, conn, sockindex);

  if(!result)
    Curl_pgrsTime(data, TIMER_APPCONNECT); /* SSL is connected */
  else
    conn->ssl[sockindex].use = FALSE;

  return result;
}